

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

FileFormat cmSystemTools::GetFileFormat(char *cext)

{
  bool bVar1;
  FileFormat FVar2;
  string ext;
  allocator local_9;
  
  FVar2 = NO_FILE_FORMAT;
  if ((cext != (char *)0x0) && (*cext != '\0')) {
    std::__cxx11::string::string((string *)&ext,cext,&local_9);
    bVar1 = std::operator==(&ext,"c");
    FVar2 = C_FILE_FORMAT;
    if (!bVar1) {
      bVar1 = std::operator==(&ext,".c");
      if (!bVar1) {
        bVar1 = std::operator==(&ext,"m");
        if (!bVar1) {
          bVar1 = std::operator==(&ext,".m");
          if (!bVar1) {
            bVar1 = std::operator==(&ext,"C");
            FVar2 = CXX_FILE_FORMAT;
            if (!bVar1) {
              bVar1 = std::operator==(&ext,".C");
              if (!bVar1) {
                bVar1 = std::operator==(&ext,"M");
                if (!bVar1) {
                  bVar1 = std::operator==(&ext,".M");
                  if (!bVar1) {
                    bVar1 = std::operator==(&ext,"c++");
                    if (!bVar1) {
                      bVar1 = std::operator==(&ext,".c++");
                      if (!bVar1) {
                        bVar1 = std::operator==(&ext,"cc");
                        if (!bVar1) {
                          bVar1 = std::operator==(&ext,".cc");
                          if (!bVar1) {
                            bVar1 = std::operator==(&ext,"cpp");
                            if (!bVar1) {
                              bVar1 = std::operator==(&ext,".cpp");
                              if (!bVar1) {
                                bVar1 = std::operator==(&ext,"cxx");
                                if (!bVar1) {
                                  bVar1 = std::operator==(&ext,".cxx");
                                  if (!bVar1) {
                                    bVar1 = std::operator==(&ext,"mm");
                                    if (!bVar1) {
                                      bVar1 = std::operator==(&ext,".mm");
                                      if (!bVar1) {
                                        bVar1 = std::operator==(&ext,"f");
                                        FVar2 = FORTRAN_FILE_FORMAT;
                                        if (!bVar1) {
                                          bVar1 = std::operator==(&ext,".f");
                                          if (!bVar1) {
                                            bVar1 = std::operator==(&ext,"F");
                                            if (!bVar1) {
                                              bVar1 = std::operator==(&ext,".F");
                                              if (!bVar1) {
                                                bVar1 = std::operator==(&ext,"f77");
                                                if (!bVar1) {
                                                  bVar1 = std::operator==(&ext,".f77");
                                                  if (!bVar1) {
                                                    bVar1 = std::operator==(&ext,"f90");
                                                    if (!bVar1) {
                                                      bVar1 = std::operator==(&ext,".f90");
                                                      if (!bVar1) {
                                                        bVar1 = std::operator==(&ext,"for");
                                                        if (!bVar1) {
                                                          bVar1 = std::operator==(&ext,".for");
                                                          if (!bVar1) {
                                                            bVar1 = std::operator==(&ext,"f95");
                                                            if (!bVar1) {
                                                              bVar1 = std::operator==(&ext,".f95");
                                                              if (!bVar1) {
                                                                bVar1 = std::operator==(&ext,"java")
                                                                ;
                                                                FVar2 = JAVA_FILE_FORMAT;
                                                                if (!bVar1) {
                                                                  bVar1 = std::operator==(&ext,
                                                  ".java");
                                                  if (!bVar1) {
                                                    bVar1 = std::operator==(&ext,"H");
                                                    FVar2 = HEADER_FILE_FORMAT;
                                                    if (!bVar1) {
                                                      bVar1 = std::operator==(&ext,".H");
                                                      if (!bVar1) {
                                                        bVar1 = std::operator==(&ext,"h");
                                                        if (!bVar1) {
                                                          bVar1 = std::operator==(&ext,".h");
                                                          if (!bVar1) {
                                                            bVar1 = std::operator==(&ext,"h++");
                                                            if (!bVar1) {
                                                              bVar1 = std::operator==(&ext,".h++");
                                                              if (!bVar1) {
                                                                bVar1 = std::operator==(&ext,"hm");
                                                                if (!bVar1) {
                                                                  bVar1 = std::operator==(&ext,".hm"
                                                                                         );
                                                                  if (!bVar1) {
                                                                    bVar1 = std::operator==(&ext,
                                                  "hpp");
                                                  if (!bVar1) {
                                                    bVar1 = std::operator==(&ext,".hpp");
                                                    if (!bVar1) {
                                                      bVar1 = std::operator==(&ext,"hxx");
                                                      if (!bVar1) {
                                                        bVar1 = std::operator==(&ext,".hxx");
                                                        if (!bVar1) {
                                                          bVar1 = std::operator==(&ext,"in");
                                                          if (!bVar1) {
                                                            bVar1 = std::operator==(&ext,".in");
                                                            if (!bVar1) {
                                                              bVar1 = std::operator==(&ext,"txx");
                                                              if (!bVar1) {
                                                                bVar1 = std::operator==(&ext,".txx")
                                                                ;
                                                                if (!bVar1) {
                                                                  bVar1 = std::operator==(&ext,"rc")
                                                                  ;
                                                                  FVar2 = RESOURCE_FILE_FORMAT;
                                                                  if (!bVar1) {
                                                                    bVar1 = std::operator==(&ext,
                                                  ".rc");
                                                  if (!bVar1) {
                                                    bVar1 = std::operator==(&ext,"def");
                                                    FVar2 = DEFINITION_FILE_FORMAT;
                                                    if (!bVar1) {
                                                      bVar1 = std::operator==(&ext,".def");
                                                      if (!bVar1) {
                                                        bVar1 = std::operator==(&ext,"lib");
                                                        FVar2 = STATIC_LIBRARY_FILE_FORMAT;
                                                        if (!bVar1) {
                                                          bVar1 = std::operator==(&ext,".lib");
                                                          if (!bVar1) {
                                                            bVar1 = std::operator==(&ext,"a");
                                                            if (!bVar1) {
                                                              bVar1 = std::operator==(&ext,".a");
                                                              if (!bVar1) {
                                                                bVar1 = std::operator==(&ext,"o");
                                                                FVar2 = OBJECT_FILE_FORMAT;
                                                                if (!bVar1) {
                                                                  bVar1 = std::operator==(&ext,".o")
                                                                  ;
                                                                  if (!bVar1) {
                                                                    bVar1 = std::operator==(&ext,
                                                  "obj");
                                                  if (!bVar1) {
                                                    bVar1 = std::operator==(&ext,".obj");
                                                    if (!bVar1) {
                                                      bVar1 = std::operator==(&ext,"so");
                                                      FVar2 = SHARED_LIBRARY_FILE_FORMAT;
                                                      if (!bVar1) {
                                                        bVar1 = std::operator==(&ext,".so");
                                                        if (!bVar1) {
                                                          bVar1 = std::operator==(&ext,"sl");
                                                          if (!bVar1) {
                                                            bVar1 = std::operator==(&ext,".sl");
                                                            if (!bVar1) {
                                                              bVar1 = std::operator==(&ext,"dll");
                                                              if (!bVar1) {
                                                                bVar1 = std::operator==(&ext,".dll")
                                                                ;
                                                                FVar2 = (uint)!bVar1 +
                                                                        (uint)!bVar1 * 2 +
                                                                        SHARED_LIBRARY_FILE_FORMAT;
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&ext);
  }
  return FVar2;
}

Assistant:

cmSystemTools::FileFormat cmSystemTools::GetFileFormat(const char* cext)
{
  if ( ! cext || *cext == 0 )
    {
    return cmSystemTools::NO_FILE_FORMAT;
    }
  //std::string ext = cmSystemTools::LowerCase(cext);
  std::string ext = cext;
  if ( ext == "c" || ext == ".c" ||
       ext == "m" || ext == ".m"
    ) { return cmSystemTools::C_FILE_FORMAT; }
  if (
    ext == "C" || ext == ".C" ||
    ext == "M" || ext == ".M" ||
    ext == "c++" || ext == ".c++" ||
    ext == "cc" || ext == ".cc" ||
    ext == "cpp" || ext == ".cpp" ||
    ext == "cxx" || ext == ".cxx" ||
    ext == "mm" || ext == ".mm"
    ) { return cmSystemTools::CXX_FILE_FORMAT; }
  if (
    ext == "f" || ext == ".f" ||
    ext == "F" || ext == ".F" ||
    ext == "f77" || ext == ".f77" ||
    ext == "f90" || ext == ".f90" ||
    ext == "for" || ext == ".for" ||
    ext == "f95" || ext == ".f95"
    ) { return cmSystemTools::FORTRAN_FILE_FORMAT; }
  if ( ext == "java" || ext == ".java" )
    { return cmSystemTools::JAVA_FILE_FORMAT; }
  if (
    ext == "H" || ext == ".H" ||
    ext == "h" || ext == ".h" ||
    ext == "h++" || ext == ".h++" ||
    ext == "hm" || ext == ".hm" ||
    ext == "hpp" || ext == ".hpp" ||
    ext == "hxx" || ext == ".hxx" ||
    ext == "in" || ext == ".in" ||
    ext == "txx" || ext == ".txx"
    ) { return cmSystemTools::HEADER_FILE_FORMAT; }
  if ( ext == "rc" || ext == ".rc" )
    { return cmSystemTools::RESOURCE_FILE_FORMAT; }
  if ( ext == "def" || ext == ".def" )
    { return cmSystemTools::DEFINITION_FILE_FORMAT; }
  if ( ext == "lib" || ext == ".lib" ||
       ext == "a" || ext == ".a")
    { return cmSystemTools::STATIC_LIBRARY_FILE_FORMAT; }
  if ( ext == "o" || ext == ".o" ||
       ext == "obj" || ext == ".obj")
    { return cmSystemTools::OBJECT_FILE_FORMAT; }
#ifdef __APPLE__
  if ( ext == "dylib" || ext == ".dylib" )
    { return cmSystemTools::SHARED_LIBRARY_FILE_FORMAT; }
  if ( ext == "so" || ext == ".so" ||
       ext == "bundle" || ext == ".bundle" )
    { return cmSystemTools::MODULE_FILE_FORMAT; }
#else // __APPLE__
  if ( ext == "so" || ext == ".so" ||
       ext == "sl" || ext == ".sl" ||
       ext == "dll" || ext == ".dll" )
    { return cmSystemTools::SHARED_LIBRARY_FILE_FORMAT; }
#endif // __APPLE__
  return cmSystemTools::UNKNOWN_FILE_FORMAT;
}